

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpc_cs.c
# Opt level: O1

int jpc_poc_dumpparms(jpc_ms_t *ms,FILE *out)

{
  jpc_pocpchg_t *pjVar1;
  uint uVar2;
  ulong uVar3;
  
  if (0 < (ms->parms).soc) {
    pjVar1 = (ms->parms).poc.pchgs;
    uVar3 = 0;
    do {
      fprintf((FILE *)out,"po[%d] = %d; ",uVar3,(ulong)pjVar1->prgord);
      fprintf((FILE *)out,"cs[%d] = %lu; ce[%d] = %lu; ",uVar3,pjVar1->compnostart,uVar3,
              pjVar1->compnoend);
      fprintf((FILE *)out,"rs[%d] = %d; re[%d] = %d; ",uVar3,(ulong)pjVar1->rlvlnostart,uVar3,
              (ulong)pjVar1->rlvlnoend);
      fprintf((FILE *)out,"le[%d] = %lu\n",uVar3,pjVar1->lyrnoend);
      uVar2 = (int)uVar3 + 1;
      uVar3 = (ulong)uVar2;
      pjVar1 = pjVar1 + 1;
    } while ((int)uVar2 < (ms->parms).soc);
  }
  return 0;
}

Assistant:

static int jpc_poc_dumpparms(jpc_ms_t *ms, FILE *out)
{
	jpc_poc_t *poc = &ms->parms.poc;
	jpc_pocpchg_t *pchg;
	int pchgno;
	for (pchgno = 0, pchg = poc->pchgs; pchgno < poc->numpchgs;
	  ++pchgno, ++pchg) {
		fprintf(out, "po[%d] = %d; ", pchgno, pchg->prgord);
		fprintf(out, "cs[%d] = %"PRIuFAST16"; ce[%d] = %"PRIuFAST16"; ",
		  pchgno, pchg->compnostart, pchgno, pchg->compnoend);
		fprintf(out, "rs[%d] = %d; re[%d] = %d; ",
		  pchgno, pchg->rlvlnostart, pchgno, pchg->rlvlnoend);
		fprintf(out, "le[%d] = %"PRIuFAST16"\n", pchgno, pchg->lyrnoend);
	}
	return 0;
}